

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void SetMaterialTextureProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *r,
               OcclusionTextureInfo *prop,aiMaterial *mat,aiTextureType texType,uint texSlot)

{
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *pvVar1;
  
  SetMaterialTextureProperty(embeddedTexIdxs,r,prop->super_TextureInfo,mat,texType,texSlot);
  pvVar1 = (prop->super_TextureInfo).texture.vector;
  if ((pvVar1 != (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) &&
     (*(long *)(*(long *)((long)(pvVar1->
                                super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>
                                )._M_impl.super__Vector_impl_data._M_start +
                         (ulong)(prop->super_TextureInfo).texture.index * 8) + 0x60) != 0)) {
    aiMaterial::AddProperty(mat,&prop->strength,1,"$tex.strength",texType,texSlot);
    return;
  }
  return;
}

Assistant:

inline void SetMaterialTextureProperty(std::vector<int>& embeddedTexIdxs, Asset& r, glTF2::OcclusionTextureInfo& prop, aiMaterial* mat, aiTextureType texType, unsigned int texSlot = 0)
{
    SetMaterialTextureProperty( embeddedTexIdxs, r, (glTF2::TextureInfo) prop, mat, texType, texSlot );

    if (prop.texture && prop.texture->source) {
        mat->AddProperty(&prop.strength, 1, AI_MATKEY_GLTF_TEXTURE_STRENGTH(texType, texSlot));
    }
}